

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::clearEkkAllStatus(HEkk *this)

{
  HEkk *in_RDI;
  HighsSimplexStatus *status;
  
  (in_RDI->status_).initialised_for_new_lp = false;
  (in_RDI->status_).initialised_for_solve = false;
  clearNlaStatus((HEkk *)&in_RDI->status_);
  clearEkkDataStatus(in_RDI);
  return;
}

Assistant:

void HEkk::clearEkkAllStatus() {
  // Clears the Ekk status entirely. Functionally junks all
  // information relating to the simplex solve, but doesn't clear the
  // associated data scalars and vectors.
  HighsSimplexStatus& status = this->status_;
  status.initialised_for_new_lp = false;
  status.initialised_for_solve = false;
  this->clearNlaStatus();
  this->clearEkkDataStatus();
}